

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cc
# Opt level: O0

void __thiscall t_server::f_remove(t_server *this,t_client *a_client)

{
  bool bVar1;
  const_iterator local_40;
  __normal_iterator<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_> local_38;
  t_client **local_30;
  __normal_iterator<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_> local_28;
  __normal_iterator<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_> local_20;
  __normal_iterator<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_> i;
  t_client *a_client_local;
  t_server *this_local;
  
  i._M_current = (t_client **)a_client;
  local_28._M_current =
       (t_client **)std::vector<t_client_*,_std::allocator<t_client_*>_>::begin(&this->v_clients);
  local_30 = (t_client **)
             std::vector<t_client_*,_std::allocator<t_client_*>_>::end(&this->v_clients);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<t_client**,std::vector<t_client*,std::allocator<t_client*>>>,t_client*>
                       (local_28,(__normal_iterator<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_>
                                  )local_30,(t_client **)&i);
  local_38._M_current =
       (t_client **)std::vector<t_client_*,_std::allocator<t_client_*>_>::end(&this->v_clients);
  bVar1 = __gnu_cxx::operator==<t_client_**,_std::vector<t_client_*,_std::allocator<t_client_*>_>_>
                    (&local_20,&local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<t_client*const*,std::vector<t_client*,std::allocator<t_client*>>>::
    __normal_iterator<t_client**>
              ((__normal_iterator<t_client*const*,std::vector<t_client*,std::allocator<t_client*>>>
                *)&local_40,&local_20);
    std::vector<t_client_*,_std::allocator<t_client_*>_>::erase(&this->v_clients,local_40);
  }
  return;
}

Assistant:

void t_server::f_remove(t_client* a_client)
{
	auto i = std::find(v_clients.begin(), v_clients.end(), a_client);
	if (i != v_clients.end()) v_clients.erase(i);
}